

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashMap.hpp
# Opt level: O2

Iterator __thiscall
HashMap<Socket_*,_Socket::Poll::Private::SocketInfo>::insert
          (HashMap<Socket_*,_Socket::Poll::Private::SocketInfo> *this,Iterator *position,
          Socket **key,SocketInfo *value)

{
  Socket *pSVar1;
  Item *pIVar2;
  uint uVar3;
  SOCKET SVar4;
  Iterator IVar5;
  Item **ppIVar6;
  ItemBlock *pIVar7;
  Item *pIVar8;
  Iterator *pIVar9;
  ulong uVar10;
  
  IVar5 = find(this,key);
  if (IVar5.item == (this->_end).item) {
    if (this->data == (Item **)0x0) {
      uVar10 = this->capacity << 3;
      ppIVar6 = (Item **)operator_new__(uVar10);
      this->data = ppIVar6;
      Memory::zero(ppIVar6,uVar10);
    }
    IVar5.item = this->freeItem;
    if (IVar5.item == (Item *)0x0) {
      pIVar7 = (ItemBlock *)operator_new__(0xe8);
      pIVar7->next = this->blocks;
      this->blocks = pIVar7;
      pIVar8 = (Item *)0x0;
      for (uVar10 = 0x40; uVar10 < 0xe8; uVar10 = uVar10 + 0x38) {
        *(Item **)((long)&pIVar7[5].next + uVar10) = pIVar8;
        pIVar8 = (Item *)((long)&pIVar7->next + uVar10);
      }
      IVar5.item = (Item *)(pIVar7 + 1);
    }
    else {
      pIVar8 = (IVar5.item)->prev;
    }
    this->freeItem = pIVar8;
    pSVar1 = *key;
    (IVar5.item)->key = pSVar1;
    uVar3 = value->events;
    SVar4 = value->s;
    ((IVar5.item)->value).socket = value->socket;
    ((IVar5.item)->value).events = uVar3;
    ((IVar5.item)->value).s = SVar4;
    ppIVar6 = this->data + ((ulong)pSVar1 >> 3) % this->capacity;
    (IVar5.item)->cell = ppIVar6;
    pIVar8 = *ppIVar6;
    (IVar5.item)->nextCell = pIVar8;
    if (pIVar8 != (Item *)0x0) {
      pIVar8->cell = &(IVar5.item)->nextCell;
    }
    *ppIVar6 = IVar5.item;
    pIVar8 = position->item;
    pIVar2 = pIVar8->prev;
    (IVar5.item)->prev = pIVar2;
    pIVar9 = (Iterator *)&pIVar2->next;
    if (pIVar2 == (Item *)0x0) {
      pIVar9 = &this->_begin;
    }
    pIVar9->item = IVar5.item;
    (IVar5.item)->next = pIVar8;
    pIVar8->prev = IVar5.item;
    this->_size = this->_size + 1;
  }
  else {
    uVar3 = value->events;
    SVar4 = value->s;
    ((IVar5.item)->value).socket = value->socket;
    ((IVar5.item)->value).events = uVar3;
    ((IVar5.item)->value).s = SVar4;
  }
  return (Iterator)IVar5.item;
}

Assistant:

Iterator insert(const Iterator& position, const T& key, const V& value)
  {
    Iterator it = find(key);
    if(it != _end)
    {
      *it = value;
      return it;
    }

    if(!data)
    {
      data = (Item**)new char[sizeof(Item*) * capacity];
      Memory::zero(data, sizeof(Item*) * capacity);
    }
    
    Item* item;
    if(freeItem)
    {
      item = freeItem;
      freeItem = freeItem->prev;
    }
    else
    {
      ItemBlock* itemBlock = (ItemBlock*)new char[sizeof(ItemBlock) + sizeof(Item) * 4];
      itemBlock->next = blocks;
      blocks = itemBlock;
      item = (Item*)((char*)itemBlock + sizeof(ItemBlock));

      for(Item* i = item + 1, * end = item + 4; i < end; ++i)
      {
        i->prev = freeItem;
        freeItem = i;
      }
    }

    usize hashCode = hash(key);
#ifdef VERIFY
    VERIFY(new(item) Item(key, value) == item);
#else
    new(item) Item(key, value);
#endif

    Item** cell;
    item->cell = (cell = &data[hashCode % capacity]);
    if((item->nextCell = *cell))
      item->nextCell->cell = &item->nextCell;
    *cell = item;
    
    Item* insertPos = position.item;
    if((item->prev = insertPos->prev))
      insertPos->prev->next = item;
    else
      _begin.item = item;

    item->next = insertPos;
    insertPos->prev = item;
    ++_size;
    return item;
  }